

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLOptions.h
# Opt level: O0

CLDouble * __thiscall CLDouble::operator=(CLDouble *this,string *other)

{
  string *in_RSI;
  CLDouble *in_RDI;
  stringstream sstream;
  stringstream local_198 [16];
  ostream local_188 [376];
  string *local_10;
  
  local_10 = in_RSI;
  std::__cxx11::stringstream::stringstream(local_198);
  std::operator<<(local_188,local_10);
  std::istream::operator>>((istream *)local_198,&(in_RDI->super_CLParam<double>).value);
  (in_RDI->super_CLParam<double>).is_set = true;
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

CLDouble& operator=(const std::string& other) {
        std::stringstream sstream ;
        sstream << other ;
        sstream >> value ;
        is_set = true ;
        return *this ;
    }